

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParsePageSize(WastParser *this,uint32_t *out_page_size)

{
  uint uVar1;
  bool bVar2;
  Result RVar3;
  Result RVar4;
  undefined4 *puVar5;
  Enum EVar6;
  Token token;
  Token local_e8;
  Token local_a8;
  undefined4 local_68 [8];
  undefined4 local_48 [8];
  
  bVar2 = PeekMatchLpar(this,PageSize);
  EVar6 = Ok;
  if (bVar2) {
    if (this->options_[0x12] == (WastParseOptions)0x0) {
      GetToken(&local_e8,this);
      Error(this,0x1ed7a4);
      EVar6 = Error;
    }
    else {
      RVar3 = Expect(this,Lpar);
      EVar6 = Error;
      if ((RVar3.enum_ != Error) && (RVar3 = Expect(this,PageSize), RVar3.enum_ != Error)) {
        GetToken(&local_a8,this);
        if (local_a8.token_type_ - First_Literal < 3) {
          RVar3 = ParseInt32(local_a8.field_2.literal_.text._M_str,
                             local_a8.field_2.text_._M_str +
                             (long)local_a8.field_2.literal_.text._M_str,out_page_size,UnsignedOnly)
          ;
          uVar1 = *out_page_size - 1;
          if (uVar1 < (*out_page_size ^ uVar1)) {
            Consume(&local_e8,this);
            RVar4 = Expect(this,Rpar);
            if (RVar4.enum_ == Error) {
              return (Result)Error;
            }
            return (Result)(uint)(RVar3.enum_ == Error);
          }
          GetToken(&local_e8,this);
          puVar5 = local_68;
        }
        else {
          GetToken(&local_e8,this);
          puVar5 = local_48;
        }
        puVar5[4] = local_e8.loc.field_1.field_0.line;
        puVar5[5] = local_e8.loc.field_1.field_0.first_column;
        puVar5[6] = local_e8.loc.field_1.field_0.last_column;
        puVar5[7] = local_e8.loc.field_1._12_4_;
        *puVar5 = (undefined4)local_e8.loc.filename._M_len;
        puVar5[1] = local_e8.loc.filename._M_len._4_4_;
        puVar5[2] = local_e8.loc.filename._M_str._0_4_;
        puVar5[3] = local_e8.loc.filename._M_str._4_4_;
        Error(this,0x1ed7cf);
      }
    }
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParsePageSize(uint32_t* out_page_size) {
  WABT_TRACE(ParsePageSize);

  Result result = Result::Ok;

  if (PeekMatchLpar(TokenType::PageSize)) {
    if (!options_->features.custom_page_sizes_enabled()) {
      Error(GetLocation(), "Specifying memory page size is not allowed");
      return Result::Error;
    }
    EXPECT(Lpar);
    EXPECT(PageSize);
    auto token = GetToken();
    if (!token.HasLiteral()) {
      Error(GetLocation(), "malformed custom page size");
      return Result::Error;
    }
    auto sv = token.literal().text;
    result |= ParseInt32(sv, out_page_size, ParseIntType::UnsignedOnly);
    if (*out_page_size > UINT32_MAX || *out_page_size <= 0 ||
        (*out_page_size & (*out_page_size - 1))) {
      Error(GetLocation(), "malformed custom page size");
      return Result::Error;
    }
    Consume();
    EXPECT(Rpar);
  }

  return result;
}